

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.hpp
# Opt level: O2

shared_ptr<libtorrent::aux::udp_tracker_connection> __thiscall
libtorrent::aux::udp_tracker_connection::shared_from_this(udp_tracker_connection *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<libtorrent::aux::udp_tracker_connection> sVar1;
  
  tracker_connection::shared_from_this((tracker_connection *)&stack0xffffffffffffffe0);
  ::std::
  static_pointer_cast<libtorrent::aux::udp_tracker_connection,libtorrent::aux::tracker_connection>
            ((shared_ptr<libtorrent::aux::tracker_connection> *)this);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  sVar1.super___shared_ptr<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this;
  return (shared_ptr<libtorrent::aux::udp_tracker_connection>)
         sVar1.
         super___shared_ptr<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<udp_tracker_connection> shared_from_this()
		{
			return std::static_pointer_cast<udp_tracker_connection>(
				tracker_connection::shared_from_this());
		}